

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O1

void __thiscall Poisson::prepareNextState(Poisson *this)

{
  prepareNextState((Poisson *)
                   &this[-1].super_StochasticEventGenerator.super_StochasticVariable.
                    super_StochasticProcess.super_Physical.physicalUnit.sUnitSymbol.field_2);
  return;
}

Assistant:

void Poisson::prepareNextState()
{
	if (!stochNextStateIsPrepared) {
		if( dRandE() < poissonRate ) {
			stochNextValue += 1.0;
            eventNextValue = true;
        }
        else
            eventNextValue = false;
		stochNextStateIsPrepared = true;
	}
}